

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O3

curi_status
parse_segments(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  curi_status cVar1;
  char *pcVar2;
  curi_status cVar3;
  ulong uVar4;
  
  uVar4 = *offset;
  pcVar2 = uri + uVar4;
  if (len <= uVar4) {
    pcVar2 = "";
  }
  *offset = uVar4 + 1;
  cVar3 = curi_status_success;
  if (*pcVar2 == '/') {
    cVar3 = curi_status_success;
    do {
      cVar1 = parse_segment(uri,len,offset,settings,userData,0);
      if (cVar1 == curi_status_error) break;
      uVar4 = *offset;
      pcVar2 = uri + uVar4;
      if (len <= uVar4) {
        pcVar2 = "";
      }
      *offset = uVar4 + 1;
      cVar3 = cVar1;
    } while (*pcVar2 == '/');
  }
  *offset = uVar4;
  return cVar3;
}

Assistant:

static curi_status parse_segments(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // segments  = *( "/" segment )
    curi_status status = curi_status_success;

    for ( ; ; )
    {
        size_t initialOffset = *offset;
        curi_status tryStatus = curi_status_success;

        if (tryStatus == curi_status_success)
            tryStatus = parse_char('/', uri, len, offset, settings, userData);

        if (tryStatus == curi_status_success)
            tryStatus = parse_segment(uri, len, offset, settings, userData, 0);

        if (tryStatus == curi_status_error)
        {
            *offset = initialOffset;
            break;
        }
        else
            status = tryStatus;
    }

    return status;
}